

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavInitRequestApplyResult(void)

{
  ImVec2 *pIVar1;
  ImGuiNavLayer IVar2;
  ImGuiID IVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiWindow *pIVar7;
  
  pIVar5 = GImGui;
  pIVar7 = GImGui->NavWindow;
  if (pIVar7 != (ImGuiWindow *)0x0) {
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n",
               (ulong)GImGui->NavInitResultId,(ulong)GImGui->NavLayer,pIVar7->Name);
      pIVar7 = GImGui->NavWindow;
    }
    pIVar6 = GImGui;
    IVar2 = pIVar5->NavLayer;
    IVar3 = pIVar5->NavInitResultId;
    GImGui->NavId = IVar3;
    pIVar6->NavLayer = IVar2;
    pIVar6->NavFocusScopeId = 0;
    pIVar7->NavLastIds[IVar2] = IVar3;
    IVar4 = (pIVar5->NavInitResultRectRel).Max;
    pIVar1 = &pIVar6->NavWindow->NavRectRel[IVar2].Min;
    *pIVar1 = (pIVar5->NavInitResultRectRel).Min;
    pIVar1[1] = IVar4;
    pIVar5->NavIdIsAlive = true;
    pIVar6 = GImGui;
    if (pIVar5->NavInitRequestFromMove == true) {
      pIVar5 = GImGui;
      pIVar5->NavMousePosDirty = true;
      pIVar5->NavDisableHighlight = false;
      pIVar6->NavDisableMouseHover = true;
    }
  }
  return;
}

Assistant:

void ImGui::NavInitRequestApplyResult()
{
    // In very rare cases g.NavWindow may be null (e.g. clearing focus after requesting an init request, which does happen when releasing Alt while clicking on void)
    ImGuiContext& g = *GImGui;
    if (!g.NavWindow)
        return;

    // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
    // FIXME-NAV: On _NavFlattened windows, g.NavWindow will only be updated during subsequent frame. Not a problem currently.
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n", g.NavInitResultId, g.NavLayer, g.NavWindow->Name);
    SetNavID(g.NavInitResultId, g.NavLayer, 0, g.NavInitResultRectRel);
    g.NavIdIsAlive = true; // Mark as alive from previous frame as we got a result
    if (g.NavInitRequestFromMove)
        NavRestoreHighlightAfterMove();
}